

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

void PutFilterHeader(VP8BitWriter *bw,VP8EncFilterHeader *hdr)

{
  uint value;
  int iVar1;
  uint nb_bits;
  VP8BitWriter *in_RSI;
  int need_update;
  int use_lf_delta;
  int in_stack_ffffffffffffffe8;
  
  value = (uint)(in_RSI->nb_bits_ != 0);
  VP8PutBitUniform(in_RSI,value);
  VP8PutBits(in_RSI,value,in_stack_ffffffffffffffe8);
  VP8PutBits(in_RSI,value,in_stack_ffffffffffffffe8);
  iVar1 = VP8PutBitUniform(in_RSI,value);
  if (iVar1 != 0) {
    nb_bits = (uint)(in_RSI->nb_bits_ != 0);
    iVar1 = VP8PutBitUniform(in_RSI,value);
    if (iVar1 != 0) {
      VP8PutBits(in_RSI,value,nb_bits);
      VP8PutSignedBits(in_RSI,value,nb_bits);
      VP8PutBits(in_RSI,value,nb_bits);
    }
  }
  return;
}

Assistant:

static void PutFilterHeader(VP8BitWriter* const bw,
                            const VP8EncFilterHeader* const hdr) {
  const int use_lf_delta = (hdr->i4x4_lf_delta_ != 0);
  VP8PutBitUniform(bw, hdr->simple_);
  VP8PutBits(bw, hdr->level_, 6);
  VP8PutBits(bw, hdr->sharpness_, 3);
  if (VP8PutBitUniform(bw, use_lf_delta)) {
    // '0' is the default value for i4x4_lf_delta_ at frame #0.
    const int need_update = (hdr->i4x4_lf_delta_ != 0);
    if (VP8PutBitUniform(bw, need_update)) {
      // we don't use ref_lf_delta => emit four 0 bits
      VP8PutBits(bw, 0, 4);
      // we use mode_lf_delta for i4x4
      VP8PutSignedBits(bw, hdr->i4x4_lf_delta_, 6);
      VP8PutBits(bw, 0, 3);    // all others unused
    }
  }
}